

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MyXmlParser::onStartElement(MyXmlParser *this,char *name,char **attributes)

{
  printIndent(this);
  printf("<%s",name);
  if (*attributes != (char *)0x0) {
    putchar(10);
    this->m_indent = this->m_indent + 1;
    for (; *attributes != (char *)0x0; attributes = attributes + 2) {
      printIndent(this);
      printf("%s = %s\n",*attributes,attributes[1]);
    }
    this->m_indent = this->m_indent - 1;
    printIndent(this);
  }
  puts(">");
  this->m_indent = this->m_indent + 1;
  return;
}

Assistant:

void
	onStartElement(
		const char* name,
		const char** attributes
	) {
		printIndent();
		printf("<%s", name);

		if (*attributes) {
			printf("\n");
			m_indent++;

			while (*attributes) {
				printIndent();
				printf("%s = %s\n", attributes [0], attributes [1]);
				attributes += 2;
			}

			m_indent--;
			printIndent();
		}

		printf(">\n");
		m_indent++;
	}